

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeKernelGetBinaryExp(ze_kernel_handle_t hKernel,size_t *pSize,uint8_t *pKernelBinary)

{
  ze_result_t zVar1;
  
  if (DAT_0010e698 != (code *)0x0) {
    zVar1 = (*DAT_0010e698)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetBinaryExp(
        ze_kernel_handle_t hKernel,                     ///< [in] Kernel handle.
        size_t* pSize,                                  ///< [in,out] pointer to variable with size of GEN ISA binary.
        uint8_t* pKernelBinary                          ///< [in,out] pointer to storage area for GEN ISA binary function.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBinaryExp = context.zeDdiTable.KernelExp.pfnGetBinaryExp;
        if( nullptr != pfnGetBinaryExp )
        {
            result = pfnGetBinaryExp( hKernel, pSize, pKernelBinary );
        }
        else
        {
            // generic implementation
        }

        return result;
    }